

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineLibraryCreateInfoKHR *create_info,ScratchAllocator *alloc)

{
  void *pvVar1;
  undefined8 uVar2;
  VkPipeline *ppVVar3;
  undefined8 *puVar4;
  void *__dest;
  size_t size;
  
  puVar4 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar4 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)create_info;
    pvVar1 = create_info->pNext;
    ppVVar3 = create_info->pLibraries;
    puVar4[2] = *(undefined8 *)&create_info->libraryCount;
    puVar4[3] = ppVVar3;
    *puVar4 = uVar2;
    puVar4[1] = pvVar1;
  }
  if ((ulong)*(uint *)(puVar4 + 2) != 0) {
    pvVar1 = (void *)puVar4[3];
    size = (ulong)*(uint *)(puVar4 + 2) << 3;
    __dest = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (__dest != (void *)0x0) {
      memmove(__dest,pvVar1,size);
      goto LAB_001670e8;
    }
  }
  __dest = (void *)0x0;
LAB_001670e8:
  puVar4[3] = __dest;
  return puVar4;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineLibraryCreateInfoKHR *create_info,
                                             ScratchAllocator &alloc)
{
	auto *libraries = copy(create_info, 1, alloc);
	libraries->pLibraries = copy(libraries->pLibraries, libraries->libraryCount, alloc);
	return libraries;
}